

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

vector_t **** gauden_alloc_param_full(uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  uint uVar1;
  vector_t ****pppppfVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong d2;
  
  d2 = (ulong)n_feat;
  uVar5 = 0;
  iVar6 = 0;
  for (uVar4 = 0; d2 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = veclen[uVar4];
    iVar6 = iVar6 + uVar1;
    if (uVar5 < uVar1) {
      uVar5 = uVar1;
    }
  }
  pppppfVar2 = (vector_t ****)
               __ckd_calloc_4d__((ulong)n_cb,d2,(ulong)n_density,(ulong)uVar5,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                 ,0xf4);
  pvVar3 = __ckd_calloc__((ulong)(iVar6 * iVar6 * n_density * n_cb),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0xf7);
  uVar5 = 0;
  for (uVar4 = 0; uVar4 != n_cb; uVar4 = uVar4 + 1) {
    for (uVar7 = 0; uVar7 != d2; uVar7 = uVar7 + 1) {
      for (uVar8 = 0; uVar8 != n_density; uVar8 = uVar8 + 1) {
        uVar1 = veclen[uVar7];
        for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
          pppppfVar2[uVar4][uVar7][uVar8][uVar9] = (vector_t)((long)pvVar3 + (ulong)uVar5 * 4);
          uVar5 = uVar5 + uVar1;
        }
      }
    }
  }
  return pppppfVar2;
}

Assistant:

vector_t ****
gauden_alloc_param_full(uint32 n_cb,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen)
{
    uint32 blksize, maxveclen;
    vector_t ****param;
    float32 *buf;
    uint32 i, j, k, l, m;

    for (blksize = 0, maxveclen = 0, j = 0; j < n_feat; j++) {
	blksize += veclen[j];
	if (veclen[j] > maxveclen) maxveclen = veclen[j];
    }

    param = (vector_t ****) ckd_calloc_4d(n_cb, n_feat, n_density,
					  maxveclen, sizeof(vector_t));
    
    buf = ckd_calloc(n_cb * n_density * blksize * blksize,
		     sizeof(float32));

    for (i = 0, m = 0; i < n_cb; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    param[i][j][k][l] = &buf[m];

		    m += veclen[j];
		}
	    }
	}
    }
    
    return param;
}